

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O2

string * __thiscall
pbrt::MixMaterial::ToString_abi_cxx11_(string *__return_storage_ptr__,MixMaterial *this)

{
  FloatTextureHandle *in_R9;
  
  StringPrintf<pbrt::MaterialHandle_const&,pbrt::MaterialHandle_const&,pbrt::FloatTextureHandle_const&>
            (__return_storage_ptr__,(pbrt *)"[ MixMaterial materials: [ %s %s ] amount: %s ]",
             (char *)this->materials,this->materials + 1,(MaterialHandle *)this,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string MixMaterial::ToString() const {
    return StringPrintf("[ MixMaterial materials: [ %s %s ] amount: %s ]", materials[0],
                        materials[1], amount);
}